

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall Search::predictor::~predictor(predictor *this)

{
  if (this->oracle_is_pointer == false) {
    v_array<unsigned_int>::delete_v(&this->oracle_actions);
  }
  if (this->allowed_is_pointer == false) {
    v_array<unsigned_int>::delete_v(&this->allowed_actions);
  }
  if (this->allowed_cost_is_pointer == false) {
    v_array<float>::delete_v(&this->allowed_actions_cost);
  }
  free_ec(this);
  v_array<unsigned_int>::delete_v(&this->condition_on_tags);
  v_array<char>::delete_v(&this->condition_on_names);
  return;
}

Assistant:

predictor::~predictor()
{
  if (!oracle_is_pointer)
    oracle_actions.delete_v();
  if (!allowed_is_pointer)
    allowed_actions.delete_v();
  if (!allowed_cost_is_pointer)
    allowed_actions_cost.delete_v();
  free_ec();
  condition_on_tags.delete_v();
  condition_on_names.delete_v();
}